

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

Kit_Node_t * Kit_GraphNodeFanin0(Kit_Graph_t *pGraph,Kit_Node_t *pNode)

{
  Kit_Node_t *pKVar1;
  
  if ((int)(((long)pNode - (long)pGraph->pNodes) / 0x18) < pGraph->nLeaves) {
    pKVar1 = (Kit_Node_t *)0x0;
  }
  else {
    pKVar1 = pGraph->pNodes + ((uint)pNode->eEdge0 >> 1 & 0x3fffffff);
  }
  return pKVar1;
}

Assistant:

static inline Kit_Node_t * Kit_GraphNodeFanin0( Kit_Graph_t * pGraph, Kit_Node_t * pNode ){ return Kit_GraphNodeIsVar(pGraph, pNode)? NULL : Kit_GraphNode(pGraph, pNode->eEdge0.Node);     }